

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
V2Transport::GetMessageType_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,V2Transport *this,Span<const_unsigned_char> *contents)

{
  char *pcVar1;
  byte bVar2;
  ulong uVar3;
  _func_int **pp_Var4;
  long lVar5;
  long in_FS_OFFSET;
  string ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = *(ulong *)&(this->m_cipher).m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>
                     ._M_payload.super__Optional_payload<FSChaCha20,_true,_false,_false>.
                     super__Optional_payload_base<FSChaCha20>._M_payload;
  if (uVar3 != 0) {
    pp_Var4 = (this->super_Transport)._vptr_Transport;
    bVar2 = *(byte *)pp_Var4;
    pp_Var4 = (_func_int **)((long)pp_Var4 + 1);
    (this->super_Transport)._vptr_Transport = pp_Var4;
    *(ulong *)&(this->m_cipher).m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>.
               _M_payload.super__Optional_payload<FSChaCha20,_true,_false,_false>.
               super__Optional_payload_base<FSChaCha20>._M_payload = uVar3 - 1;
    if (bVar2 == 0) {
      if (0xc < uVar3) {
        for (lVar5 = 0; (lVar5 != 0xc && (*(byte *)((long)pp_Var4 + lVar5) != 0)); lVar5 = lVar5 + 1
            ) {
          if ((char)*(byte *)((long)pp_Var4 + lVar5) < ' ') goto LAB_0017906e;
        }
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,pp_Var4,(byte *)((long)pp_Var4 + lVar5));
        pp_Var4 = (this->super_Transport)._vptr_Transport;
        do {
          if (lVar5 == 0xc) {
            (this->super_Transport)._vptr_Transport = (_func_int **)((long)pp_Var4 + 0xc);
            *(long *)&(this->m_cipher).m_send_l_cipher.
                      super__Optional_base<FSChaCha20,_false,_false>._M_payload.
                      super__Optional_payload<FSChaCha20,_true,_false,_false>.
                      super__Optional_payload_base<FSChaCha20>._M_payload =
                 *(long *)&(this->m_cipher).m_send_l_cipher.
                           super__Optional_base<FSChaCha20,_false,_false>._M_payload.
                           super__Optional_payload<FSChaCha20,_true,_false,_false>.
                           super__Optional_payload_base<FSChaCha20>._M_payload + -0xc;
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      (__return_storage_ptr__,&local_40);
            goto LAB_001790f7;
          }
          pcVar1 = (char *)((long)pp_Var4 + lVar5);
          lVar5 = lVar5 + 1;
        } while (*pcVar1 == '\0');
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false;
LAB_001790f7:
        std::__cxx11::string::~string((string *)&local_40);
        goto LAB_00179072;
      }
    }
    else if (bVar2 < 0x21) {
      std::_Optional_payload_base<std::__cxx11::string>::
      _Optional_payload_base<std::__cxx11::string_const&>
                ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,
                 (anonymous_namespace)::V2_MESSAGE_IDS_abi_cxx11_ + (ulong)bVar2 * 0x20);
      goto LAB_00179072;
    }
  }
LAB_0017906e:
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
LAB_00179072:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> V2Transport::GetMessageType(Span<const uint8_t>& contents) noexcept
{
    if (contents.size() == 0) return std::nullopt; // Empty contents
    uint8_t first_byte = contents[0];
    contents = contents.subspan(1); // Strip first byte.

    if (first_byte != 0) {
        // Short (1 byte) encoding.
        if (first_byte < std::size(V2_MESSAGE_IDS)) {
            // Valid short message id.
            return V2_MESSAGE_IDS[first_byte];
        } else {
            // Unknown short message id.
            return std::nullopt;
        }
    }

    if (contents.size() < CMessageHeader::COMMAND_SIZE) {
        return std::nullopt; // Long encoding needs 12 message type bytes.
    }

    size_t msg_type_len{0};
    while (msg_type_len < CMessageHeader::COMMAND_SIZE && contents[msg_type_len] != 0) {
        // Verify that message type bytes before the first 0x00 are in range.
        if (contents[msg_type_len] < ' ' || contents[msg_type_len] > 0x7F) {
            return {};
        }
        ++msg_type_len;
    }
    std::string ret{reinterpret_cast<const char*>(contents.data()), msg_type_len};
    while (msg_type_len < CMessageHeader::COMMAND_SIZE) {
        // Verify that message type bytes after the first 0x00 are also 0x00.
        if (contents[msg_type_len] != 0) return {};
        ++msg_type_len;
    }
    // Strip message type bytes of contents.
    contents = contents.subspan(CMessageHeader::COMMAND_SIZE);
    return ret;
}